

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O1

void __thiscall ChronoTest_InvalidSpecs_Test::TestBody(ChronoTest_InvalidSpecs_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_string_view<char> format_str_15;
  basic_string_view<char> format_str_16;
  basic_string_view<char> format_str_17;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_13;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_14;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_15;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_16;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_17;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  seconds sec;
  AssertionResult gtest_ar_18;
  AssertionResult local_618;
  AssertHelper local_608 [2];
  AssertHelperData local_5f8;
  undefined1 local_5c0 [504];
  AssertionResult local_3c8;
  undefined1 *local_3b8 [2];
  undefined1 local_3a8 [16];
  undefined1 *local_398 [2];
  undefined1 local_388 [16];
  undefined1 *local_378 [2];
  undefined1 local_368 [16];
  undefined1 *local_358 [2];
  undefined1 local_348 [16];
  undefined1 *local_338 [2];
  undefined1 local_328 [16];
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  undefined1 *local_2f8 [2];
  undefined1 local_2e8 [16];
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  int *local_158;
  code *local_150;
  int *local_148;
  code *local_140;
  int *local_138;
  code *local_130;
  int *local_128;
  code *local_120;
  int *local_118;
  code *local_110;
  int *local_108;
  code *local_100;
  int *local_f8;
  code *local_f0;
  int *local_e8;
  code *local_e0;
  int *local_d8;
  code *local_d0;
  int *local_c8;
  code *local_c0;
  int *local_b8;
  code *local_b0;
  int *local_a8;
  code *local_a0;
  int *local_98;
  code *local_90;
  int *local_88;
  code *local_80;
  int *local_78;
  code *local_70;
  int *local_68;
  code *local_60;
  int *local_58;
  code *local_50;
  int *local_48;
  code *local_40;
  
  local_5f8.line = 0;
  local_5f8._20_4_ = 0;
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_158 = &local_5f8.line;
      local_150 = fmt::v5::internal::
                  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str.size_ = 5;
      format_str.data_ = "{:%a}";
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_158;
      args.types_ = fmt::v5::
                    format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
                    ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str,args,(locale_ref)0x0);
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%a}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8a,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_148 = &local_5f8.line;
      local_140 = fmt::v5::internal::
                  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_00.size_ = 5;
      format_str_00.data_ = "{:%A}";
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_148;
      args_00.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_00,args_00,(locale_ref)0x0);
      local_198[0] = local_188;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_198[0] != local_188) {
        operator_delete(local_198[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%A}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8b,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_138 = &local_5f8.line;
      local_130 = fmt::v5::internal::
                  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_01.size_ = 5;
      format_str_01.data_ = "{:%c}";
      args_01.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_138;
      args_01.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_01,args_01,(locale_ref)0x0);
      local_1b8[0] = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%c}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8c,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_128 = &local_5f8.line;
      local_120 = fmt::v5::internal::
                  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_02.size_ = 5;
      format_str_02.data_ = "{:%x}";
      args_02.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_128;
      args_02.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_02,args_02,(locale_ref)0x0);
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%x}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8d,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_118 = &local_5f8.line;
      local_110 = fmt::v5::internal::
                  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_03.size_ = 6;
      format_str_03.data_ = "{:%Ex}";
      args_03.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_118;
      args_03.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_03,args_03,(locale_ref)0x0);
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [113])
               "Expected: fmt::format(\"{:%Ex}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8e,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_108 = &local_5f8.line;
      local_100 = fmt::v5::internal::
                  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_04.size_ = 5;
      format_str_04.data_ = "{:%X}";
      args_04.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_108;
      args_04.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_04,args_04,(locale_ref)0x0);
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_218,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_218[0] != local_208) {
        operator_delete(local_218[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%X}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8f,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_f8 = &local_5f8.line;
      local_f0 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_05.size_ = 6;
      format_str_05.data_ = "{:%EX}";
      args_05.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_f8;
      args_05.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_05,args_05,(locale_ref)0x0);
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_238,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [113])
               "Expected: fmt::format(\"{:%EX}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x90,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_e8 = &local_5f8.line;
      local_e0 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_06.size_ = 5;
      format_str_06.data_ = "{:%D}";
      args_06.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_e8;
      args_06.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_06,args_06,(locale_ref)0x0);
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_258[0] != local_248) {
        operator_delete(local_258[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%D}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x91,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_d8 = &local_5f8.line;
      local_d0 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_07.size_ = 5;
      format_str_07.data_ = "{:%F}";
      args_07.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_d8;
      args_07.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_07,args_07,(locale_ref)0x0);
      local_278[0] = local_268;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_278[0] != local_268) {
        operator_delete(local_278[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%F}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x92,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_c8 = &local_5f8.line;
      local_c0 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_08.size_ = 6;
      format_str_08.data_ = "{:%Ec}";
      args_08.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_c8;
      args_08.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_08,args_08,(locale_ref)0x0);
      local_298[0] = local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_298[0] != local_288) {
        operator_delete(local_298[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [113])
               "Expected: fmt::format(\"{:%Ec}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x93,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_b8 = &local_5f8.line;
      local_b0 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_09.size_ = 5;
      format_str_09.data_ = "{:%w}";
      args_09.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_b8;
      args_09.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_09,args_09,(locale_ref)0x0);
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b8,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_2b8[0] != local_2a8) {
        operator_delete(local_2b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%w}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x94,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_a8 = &local_5f8.line;
      local_a0 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_10.size_ = 5;
      format_str_10.data_ = "{:%u}";
      args_10.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_a8;
      args_10.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_10,args_10,(locale_ref)0x0);
      local_2d8[0] = local_2c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d8,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_2d8[0] != local_2c8) {
        operator_delete(local_2d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%u}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x95,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_98 = &local_5f8.line;
      local_90 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_11.size_ = 5;
      format_str_11.data_ = "{:%b}";
      args_11.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_98;
      args_11.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_11,args_11,(locale_ref)0x0);
      local_2f8[0] = local_2e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f8,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_2f8[0] != local_2e8) {
        operator_delete(local_2f8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%b}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x96,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_88 = &local_5f8.line;
      local_80 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_12.size_ = 5;
      format_str_12.data_ = "{:%B}";
      args_12.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_88;
      args_12.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_12,args_12,(locale_ref)0x0);
      local_318[0] = local_308;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_318,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_318[0] != local_308) {
        operator_delete(local_318[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%B}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x97,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_78 = &local_5f8.line;
      local_70 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_13.size_ = 5;
      format_str_13.data_ = "{:%z}";
      args_13.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_78;
      args_13.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_13,args_13,(locale_ref)0x0);
      local_338[0] = local_328;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_338[0] != local_328) {
        operator_delete(local_338[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%z}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x98,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"no date","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_68 = &local_5f8.line;
      local_60 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_14.size_ = 5;
      format_str_14.data_ = "{:%Z}";
      args_14.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_68;
      args_14.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_14,args_14,(locale_ref)0x0);
      local_358[0] = local_348;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_358[0] != local_348) {
        operator_delete(local_358[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%Z}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x99,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"invalid format","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_58 = &local_5f8.line;
      local_50 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_15.size_ = 5;
      format_str_15.data_ = "{:%q}";
      args_15.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_58;
      args_15.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_15,args_15,(locale_ref)0x0);
      local_378[0] = local_368;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_378,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_378[0] != local_368) {
        operator_delete(local_378[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [112])
               "Expected: fmt::format(\"{:%q}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x9b,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_618.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"invalid format","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_48 = &local_5f8.line;
      local_40 = fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_16.size_ = 6;
      format_str_16.data_ = "{:%Eq}";
      args_16.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_48;
      args_16.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_16,args_16,(locale_ref)0x0);
      local_398[0] = local_388;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_398,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_398[0] != local_388) {
        operator_delete(local_398[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_618,
               (char (*) [113])
               "Expected: fmt::format(\"{:%Eq}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_618.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_618.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x9d,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_3c8.success_ == true) {
    local_608[0].data_ = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"invalid format","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_618._0_8_ = &local_5f8.line;
      local_618.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           fmt::v5::internal::
           value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
      local_5f8.message.field_2._M_allocated_capacity = 0;
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      local_5f8.message.field_2._8_8_ = 500;
      format_str_17.size_ = 6;
      format_str_17.data_ = "{:%Oq}";
      args_17.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_618;
      args_17.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
           ::TYPES;
      local_5f8.message._M_string_length = (size_type)local_5c0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_5f8.message,format_str_17,args_17,(locale_ref)0x0);
      local_3b8[0] = local_3a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b8,local_5f8.message._M_string_length,
                 (undefined1 *)
                 (local_5f8.message._M_string_length +
                 local_5f8.message.field_2._M_allocated_capacity));
      local_5f8.message._M_dataplus._M_p = (pointer)&PTR_grow_00182020;
      if ((undefined1 *)local_5f8.message._M_string_length != local_5c0) {
        operator_delete((void *)local_5f8.message._M_string_length);
      }
      if (local_3b8[0] != local_3a8) {
        operator_delete(local_3b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_3c8,
               (char (*) [113])
               "Expected: fmt::format(\"{:%Oq}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    if (local_608[0].data_ != &local_5f8) {
      operator_delete(local_608[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_5f8.message);
  if (local_3c8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_3c8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_608,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x9f,pcVar2);
  testing::internal::AssertHelper::operator=(local_608,(Message *)&local_5f8.message);
  testing::internal::AssertHelper::~AssertHelper(local_608);
  if ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((undefined **)local_5f8.message._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_5f8.message._M_dataplus._M_p + 8))();
    }
    local_5f8.message._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3c8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(ChronoTest, InvalidSpecs) {
  auto sec = std::chrono::seconds(0);
  EXPECT_THROW_MSG(fmt::format("{:%a}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%A}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%c}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%x}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%Ex}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%X}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%EX}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%D}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%F}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%Ec}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%w}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%u}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%b}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%B}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%z}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%Z}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%q}", sec), fmt::format_error,
                   "invalid format");
  EXPECT_THROW_MSG(fmt::format("{:%Eq}", sec), fmt::format_error,
                   "invalid format");
  EXPECT_THROW_MSG(fmt::format("{:%Oq}", sec), fmt::format_error,
                   "invalid format");
}